

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

void __thiscall
QMimeXMLProvider::addParents(QMimeXMLProvider *this,QString *mime,QStringList *result)

{
  bool bVar1;
  iterator str;
  iterator iVar2;
  QString *parent;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QList<QString>_>::value((QList<QString> *)&local_40,&this->m_parents,mime);
  str = QList<QString>::begin((QList<QString> *)&local_40);
  iVar2 = QList<QString>::end((QList<QString> *)&local_40);
  for (; str.i != iVar2.i; str.i = str.i + 1) {
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)result,str.i,CaseSensitive);
    if (!bVar1) {
      QList<QString>::emplaceBack<QString_const&>(result,str.i);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMimeXMLProvider::addParents(const QString &mime, QStringList &result)
{
    for (const QString &parent : m_parents.value(mime)) {
        if (!result.contains(parent))
            result.append(parent);
    }
}